

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmTasEa<(moira::Instr)125,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  Ea<(moira::Mode)3,_1> dst;
  u32 local_2c;
  ushort local_28;
  
  local_28 = op & 7;
  local_2c = *addr;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)3,_1> *)&local_2c);
  return;
}

Assistant:

void
Moira::dasmTasEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << dst;
}